

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_metric.cpp
# Opt level: O1

Reals __thiscall Omega_h::get_size_isos_dim<3>(Omega_h *this,Reals *metrics)

{
  int *piVar1;
  Alloc *pAVar2;
  _Alloc_hider _Var3;
  undefined8 uVar4;
  uint uVar5;
  void *extraout_RDX;
  void *extraout_RDX_00;
  void *extraout_RDX_01;
  void *extraout_RDX_02;
  void *extraout_RDX_03;
  void *pvVar6;
  int iVar7;
  size_t sVar8;
  Reals RVar9;
  Write<double> out;
  type f;
  Write<double> local_68;
  string local_50;
  Write<double> local_30;
  
  pAVar2 = (metrics->write_).shared_alloc_.alloc;
  if (((ulong)pAVar2 & 1) == 0) {
    sVar8 = pAVar2->size;
  }
  else {
    sVar8 = (ulong)pAVar2 >> 3;
  }
  iVar7 = (int)(sVar8 >> 3);
  uVar5 = iVar7 * -0x55555555 + 0x2aaaaaaa;
  if ((uVar5 >> 1 | (uint)((uVar5 & 1) != 0) << 0x1f) < 0x2aaaaaab) {
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"");
    iVar7 = iVar7 / 6;
    Write<double>::Write(&local_68,iVar7,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p = (pointer)(metrics->write_).shared_alloc_.alloc;
    if (((ulong)local_50._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_50._M_dataplus._M_p != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50._M_dataplus._M_p = (pointer)(((Alloc *)local_50._M_dataplus._M_p)->size * 8 + 1);
      }
      else {
        ((Alloc *)local_50._M_dataplus._M_p)->use_count =
             ((Alloc *)local_50._M_dataplus._M_p)->use_count + 1;
      }
    }
    local_50._M_string_length = (size_type)(metrics->write_).shared_alloc_.direct_ptr;
    local_50.field_2._M_allocated_capacity = (size_type)local_68.shared_alloc_.alloc;
    if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
        local_68.shared_alloc_.alloc != (Alloc *)0x0) {
      if (entering_parallel == '\x01') {
        local_50.field_2._M_allocated_capacity = (local_68.shared_alloc_.alloc)->size * 8 + 1;
      }
      else {
        (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + 1;
      }
    }
    local_50.field_2._8_8_ = local_68.shared_alloc_.direct_ptr;
    parallel_for<Omega_h::get_size_isos_dim<3>(Omega_h::Read<double>)::_lambda(int)_1_>
              (iVar7,(type *)&local_50,"get_size_isos");
    local_30.shared_alloc_.alloc = local_68.shared_alloc_.alloc;
    local_30.shared_alloc_.direct_ptr = local_68.shared_alloc_.direct_ptr;
    if ((((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
         local_68.shared_alloc_.alloc != (Alloc *)0x0) && (entering_parallel == '\x01')) {
      (local_68.shared_alloc_.alloc)->use_count = (local_68.shared_alloc_.alloc)->use_count + -1;
      local_30.shared_alloc_.alloc = (Alloc *)((local_68.shared_alloc_.alloc)->size * 8 + 1);
    }
    local_68.shared_alloc_.alloc = (Alloc *)0x0;
    local_68.shared_alloc_.direct_ptr = (void *)0x0;
    Read<double>::Read((Read<signed_char> *)this,&local_30);
    pAVar2 = local_30.shared_alloc_.alloc;
    pvVar6 = extraout_RDX;
    if (((ulong)local_30.shared_alloc_.alloc & 7) == 0 &&
        local_30.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_30.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_30.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar6 = extraout_RDX_00;
      }
    }
    uVar4 = local_50.field_2._M_allocated_capacity;
    if ((local_50.field_2._M_allocated_capacity & 7) == 0 &&
        (Alloc *)local_50.field_2._M_allocated_capacity != (Alloc *)0x0) {
      piVar1 = (int *)(local_50.field_2._M_allocated_capacity + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_50.field_2._M_allocated_capacity);
        operator_delete((void *)uVar4,0x48);
        pvVar6 = extraout_RDX_01;
      }
    }
    _Var3._M_p = local_50._M_dataplus._M_p;
    if (((ulong)local_50._M_dataplus._M_p & 7) == 0 &&
        (Alloc *)local_50._M_dataplus._M_p != (Alloc *)0x0) {
      piVar1 = (int *)(local_50._M_dataplus._M_p + 0x30);
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc((Alloc *)local_50._M_dataplus._M_p);
        operator_delete(_Var3._M_p,0x48);
        pvVar6 = extraout_RDX_02;
      }
    }
    pAVar2 = local_68.shared_alloc_.alloc;
    if (((ulong)local_68.shared_alloc_.alloc & 7) == 0 &&
        local_68.shared_alloc_.alloc != (Alloc *)0x0) {
      piVar1 = &(local_68.shared_alloc_.alloc)->use_count;
      *piVar1 = *piVar1 + -1;
      if (*piVar1 == 0) {
        Alloc::~Alloc(local_68.shared_alloc_.alloc);
        operator_delete(pAVar2,0x48);
        pvVar6 = extraout_RDX_03;
      }
    }
    RVar9.write_.shared_alloc_.direct_ptr = pvVar6;
    RVar9.write_.shared_alloc_.alloc = (Alloc *)this;
    return (Reals)RVar9.write_.shared_alloc_;
  }
  fail("assertion %s failed at %s +%d\n","a % b == 0",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_scalar.hpp"
       ,0x11a);
}

Assistant:

Reals get_size_isos_dim(Reals metrics) {
  auto n = divide_no_remainder(metrics.size(), symm_ncomps(dim));
  auto out = Write<Real>(n);
  auto f = OMEGA_H_LAMBDA(LO i) {
    auto m = get_symm<dim>(metrics, i);
    out[i] = root<dim>(determinant(m));
  };
  parallel_for(n, f, "get_size_isos");
  return out;
}